

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_row_removal<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true>>>
               (void)

{
  pointer *ppuVar1;
  pool<boost::default_user_allocator_malloc_free> *ppVar2;
  pool<boost::default_user_allocator_malloc_free> *ppVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>
  m;
  shared_count sStack_250;
  key_type local_244;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_240 [3];
  char *local_1f8;
  char *local_1f0;
  undefined **local_1e8;
  undefined1 local_1e0;
  undefined8 *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  pool<boost::default_user_allocator_malloc_free> *local_188;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>
  local_180;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true>>>>
            ();
  ppuVar1 = &local_240[0].
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[6].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  local_188 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_188->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_188->list).ptr = (char *)0x0;
  (local_188->list).sz = 0;
  local_188->requested_size = 0x20;
  local_188->next_size = 0x20;
  local_188->start_size = 0x20;
  local_188->max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true>>>
              *)&local_180,local_240,(Column_settings *)local_188);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::erase_empty_row(&local_180.super_Matrix_row_access_option,
                    local_180.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_true>_>_>_>
                    .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[5]);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x32a);
  if (local_180.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    if (local_180.nextInsertIndex_ != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar4 = ((long)local_180.matrix_.
                       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_180.matrix_.
                       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
        }
        Gudhi::persistence_matrix::
        Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true>>>
        ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true>>>
                    *)((long)&((local_180.matrix_.
                                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Row_access_option)
                              .columnIndex_ + lVar5),
                   &local_180.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_true>_>_>_>
                    .rowToIndex_,(Index)uVar6);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x38;
      } while (uVar6 < local_180.nextInsertIndex_);
      if (local_180.nextInsertIndex_ != 0) {
        uVar6 = 0;
        do {
          local_180.
          super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_true>_>_>_>
          .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (uint)uVar6;
          local_180.
          super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_true>_>_>_>
          .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (uint)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_180.nextInsertIndex_);
      }
    }
    local_180.
    super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_true>_>_>_>
    .rowSwapped_ = false;
  }
  local_244 = 5;
  std::
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>_>_>_>
  ::at(local_180.super_Matrix_row_access_option.rows_,&local_244);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x32a);
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_1e0 = 0;
  local_1e8 = &PTR__lazy_ostream_001f2710;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = "exception std::logic_error expected but not raised";
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_250);
  ppVar2 = local_188;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>
  ::_M_erase_at_end(&local_180.matrix_,
                    local_180.matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  ppVar3 = local_188;
  local_180.nextInsertIndex_ = 0;
  local_180.colSettings_ = (Column_settings *)ppVar2;
  if (local_188 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_188);
  }
  operator_delete(ppVar3,0x38);
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>
  ::~Boundary_matrix(&local_180);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(local_240);
  return;
}

Assistant:

void test_row_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  columns[6].pop_back();  // empties row 5. Not a legit boundary matrix anymore, but for the test,
                          // should be fine, except for chain.

  Matrix m(columns, 5);

  m.erase_empty_row(5);

  BOOST_CHECK_THROW(m.get_row(5), std::logic_error);
}